

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O1

bool icu_63::number::impl::AffixUtils::hasNext(AffixTag *tag,UnicodeString *string)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  char16_t *pcVar5;
  uint uVar6;
  
  uVar2 = tag->offset;
  if ((long)(int)uVar2 < 0) {
    return false;
  }
  if (uVar2 == 0) {
    sVar1 = (string->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (string->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    bVar3 = 0 < iVar4;
  }
  else {
    if (tag->state == STATE_BASE) {
      sVar1 = (string->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (string->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      return (int)uVar2 < iVar4;
    }
    bVar3 = true;
    if (tag->state == STATE_INSIDE_QUOTE) {
      sVar1 = (string->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar6 = (string->fUnion).fFields.fLength;
      }
      else {
        uVar6 = (int)sVar1 >> 5;
      }
      if (uVar2 < uVar6 && uVar2 == uVar6 - 1) {
        if (((int)sVar1 & 2U) == 0) {
          pcVar5 = (string->fUnion).fFields.fArray;
        }
        else {
          pcVar5 = (char16_t *)((long)&string->fUnion + 2);
        }
        if (pcVar5[(int)uVar2] == L'\'') {
          return false;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool AffixUtils::hasNext(const AffixTag &tag, const UnicodeString &string) {
    // First check for the {-1} and default initializer syntax.
    if (tag.offset < 0) {
        return false;
    } else if (tag.offset == 0) {
        return string.length() > 0;
    }
    // The rest of the fields are safe to use now.
    // Special case: the last character in string is an end quote.
    if (tag.state == STATE_INSIDE_QUOTE && tag.offset == string.length() - 1 &&
        string.charAt(tag.offset) == u'\'') {
        return false;
    } else if (tag.state != STATE_BASE) {
        return true;
    } else {
        return tag.offset < string.length();
    }
}